

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtablewidget.cpp
# Opt level: O0

int __thiscall QTableWidget::qt_metacall(QTableWidget *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  void **in_stack_000000d0;
  int in_stack_000000d8;
  Call in_stack_000000dc;
  QObject *in_stack_000000e0;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTableView::qt_metacall
                    ((QTableView *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX
                     ,in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 0x17) {
        qt_static_metacall(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0);
      }
      iVar1 = iVar1 + -0x17;
    }
    if (in_ESI == 7) {
      if (iVar1 < 0x17) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -0x17;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0);
      iVar1 = iVar1 + -2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QTableWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QTableView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 23)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 23;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 23)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 23;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}